

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O1

void __thiscall
soul::AST::InputEndpointRef::InputEndpointRef
          (InputEndpointRef *this,Context *c,EndpointDeclaration *i)

{
  EndpointType EVar1;
  EndpointDetails *pEVar2;
  SourceCodeText *pSVar3;
  
  pEVar2 = (i->details).object;
  if (pEVar2 != (EndpointDetails *)0x0) {
    EVar1 = pEVar2->endpointType;
    (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
         (_func_int **)&PTR__ASTObject_002d4778;
    (this->super_Expression).super_Statement.super_ASTObject.objectType = InputEndpointRef;
    pSVar3 = (c->location).sourceCode.object;
    (this->super_Expression).super_Statement.super_ASTObject.context.location.sourceCode.object =
         pSVar3;
    if (pSVar3 != (SourceCodeText *)0x0) {
      (pSVar3->super_RefCountedObject).refCount = (pSVar3->super_RefCountedObject).refCount + 1;
    }
    (this->super_Expression).super_Statement.super_ASTObject.context.location.location.data =
         (c->location).location.data;
    (this->super_Expression).super_Statement.super_ASTObject.context.parentScope = c->parentScope;
    (this->super_Expression).kind = (uint)(EVar1 == event) * 2;
    (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
         (_func_int **)&PTR__InputEndpointRef_002d7370;
    (this->input).object = i;
    return;
  }
  throwInternalCompilerError("object != nullptr","operator*",0x3b);
}

Assistant:

Type& operator*() const                                 { SOUL_ASSERT (object != nullptr); return *object; }